

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

AddressClassification __thiscall QHostAddressPrivate::classify(QHostAddressPrivate *this)

{
  quint64 qVar1;
  uint uVar2;
  AddressClassification AVar3;
  uint uVar4;
  bool bVar5;
  
  uVar2 = this->a;
  if (uVar2 == 0) {
    if ((this->field_1).a6_64.c[0] != 0) {
      uVar2 = (this->field_1).a6_32.c[0];
      uVar4 = uVar2 & 0xff;
      if (uVar4 - 0xfc < 2) {
        return UniqueLocalAddress;
      }
      if (uVar4 != 0xff) {
        if (uVar4 == 0xfe) {
          uVar2 = ((uVar2 & 0xc000) << 8 | uVar2 << 0x18) >> 0x10;
          AVar3 = SiteLocalAddress;
          if (uVar2 != 0xfec0) {
            AVar3 = (uint)(uVar2 == 0xfe80) * 3;
          }
          return AVar3;
        }
        return GlobalAddress;
      }
      return MulticastAddress;
    }
    qVar1 = (this->field_1).a6_64.c[1];
    AVar3 = LoopbackAddress;
    if (((qVar1 != 0x100000000000000) && (AVar3 = LocalNetAddress, (int)qVar1 != -0x10000)) &&
       (AVar3 = GlobalAddress, qVar1 == 0)) {
      AVar3 = (uint)(this->protocol != -1) * 2;
    }
  }
  else {
    uVar4 = uVar2 & 0xff000000;
    AVar3 = LoopbackAddress;
    if ((uVar4 != 0x7f000000) && (AVar3 = MulticastAddress, (uVar2 & 0xf0000000) != 0xe0000000)) {
      AVar3 = LinkLocalAddress;
      if ((uVar2 & 0xffff0000) != 0xa9fe0000) {
        if (uVar4 == 0) {
          return LocalNetAddress;
        }
        if (0xefffffff < uVar2) {
          return (uint)(uVar2 == 0xffffffff) * 5;
        }
        bVar5 = (uVar2 & 0xfff00000) == 0xac100000;
        AVar3 = bVar5 + 0x10 + (uint)bVar5;
        if (uVar4 == 0xa000000) {
          AVar3 = PrivateNetworkAddress;
        }
        if ((uVar2 & 0xffff0000) == 0xc0a80000) {
          AVar3 = PrivateNetworkAddress;
        }
        return AVar3;
      }
    }
  }
  return AVar3;
}

Assistant:

AddressClassification QHostAddressPrivate::classify() const
{
    if (a) {
        // This is an IPv4 address or an IPv6 v4-mapped address includes all
        // IPv6 v4-compat addresses, except for ::ffff:0.0.0.0 (because `a' is
        // zero). See setAddress(quint8*) below, which calls convertToIpv4(),
        // for details.
        // Source: RFC 5735
        if ((a & 0xff000000U) == 0x7f000000U)   // 127.0.0.0/8
            return LoopbackAddress;
        if ((a & 0xf0000000U) == 0xe0000000U)   // 224.0.0.0/4
            return MulticastAddress;
        if ((a & 0xffff0000U) == 0xa9fe0000U)   // 169.254.0.0/16
            return LinkLocalAddress;
        if ((a & 0xff000000U) == 0)             // 0.0.0.0/8 except 0.0.0.0 (handled below)
            return LocalNetAddress;
        if ((a & 0xf0000000U) == 0xf0000000U) { // 240.0.0.0/4
            if (a == 0xffffffffU)               // 255.255.255.255
                return BroadcastAddress;
            return UnknownAddress;
        }
        if (((a & 0xff000000U) == 0x0a000000U)      // 10.0.0.0/8
            || ((a & 0xfff00000U) == 0xac100000U)   // 172.16.0.0/12
            || ((a & 0xffff0000U) == 0xc0a80000U))  // 192.168.0.0/16
            return PrivateNetworkAddress;

        // Not testing for TestNetworkAddress
        // since we don't need them yet.
        return GlobalAddress;
    }

    // As `a' is zero, this address is either ::ffff:0.0.0.0 or a non-v4-mapped IPv6 address.
    // Source: https://www.iana.org/assignments/ipv6-address-space/ipv6-address-space.xhtml
    if (a6_64.c[0]) {
        quint32 high16 = qFromBigEndian(a6_32.c[0]) >> 16;
        switch (high16 >> 8) {
        case 0xff:                          // ff00::/8
            return MulticastAddress;
        case 0xfe:
            switch (high16 & 0xffc0) {
            case 0xfec0:                    // fec0::/10
                return SiteLocalAddress;

            case 0xfe80:                    // fe80::/10
                return LinkLocalAddress;

            default:                        // fe00::/9
                return UnknownAddress;
            }
        case 0xfd:                          // fc00::/7
        case 0xfc:
            return UniqueLocalAddress;
        default:
            return GlobalAddress;
        }
    }

    quint64 low64 = qFromBigEndian(a6_64.c[1]);
    if (low64 == 1)                             // ::1
        return LoopbackAddress;
    if (low64 >> 32 == 0xffff) {                // ::ffff:0.0.0.0/96
        Q_ASSERT(quint32(low64) == 0);
        return LocalNetAddress;
    }
    if (low64)                                  // not ::
        return GlobalAddress;

    if (protocol == QHostAddress::UnknownNetworkLayerProtocol)
        return UnknownAddress;

    // only :: and 0.0.0.0 remain now
    return LocalNetAddress;
}